

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

void __thiscall FEventTree::~FEventTree(FEventTree *this)

{
  FEvent *pFVar1;
  FEvent *next;
  FEvent *probe;
  FEventTree *this_local;
  
  DeleteAll(this);
  pFVar1 = this->Spare;
  while (next = pFVar1, next != (FEvent *)0x0) {
    pFVar1 = next->Left;
    if (next != (FEvent *)0x0) {
      operator_delete(next,0x28);
    }
  }
  return;
}

Assistant:

FEventTree::~FEventTree ()
{
	FEvent *probe;

	DeleteAll ();
	probe = Spare;
	while (probe != NULL)
	{
		FEvent *next = probe->Left;
		delete probe;
		probe = next;
	}
}